

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O3

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                 *this,TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                       *cp)

{
  int64_t iVar1;
  char cVar2;
  
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBaseMatrix_0198b178;
  iVar1 = (cp->super_TPZAbstractFrontMatrix<std::complex<double>_>).
          super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.fRow =
       (cp->super_TPZAbstractFrontMatrix<std::complex<double>_>).
       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.fCol = iVar1;
  cVar2 = (cp->super_TPZAbstractFrontMatrix<std::complex<double>_>).
          super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.fDecomposed =
       (cp->super_TPZAbstractFrontMatrix<std::complex<double>_>).
       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.fDefPositive = cVar2;
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFrontMatrix_01982ce0;
  (this->fStorage).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZStackEqnStorage_0198ecd0;
  TPZManVector<TPZEqnArray<std::complex<double>_>,_10>::TPZManVector
            (&(this->fStorage).fEqnStack.super_TPZManVector<TPZEqnArray<std::complex<double>_>,_10>,
             &(cp->fStorage).fEqnStack.super_TPZManVector<TPZEqnArray<std::complex<double>_>,_10>);
  (this->fStorage).fEqnStack.super_TPZManVector<TPZEqnArray<std::complex<double>_>,_10>.
  super_TPZVec<TPZEqnArray<std::complex<double>_>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0198ed40;
  TPZFront<std::complex<double>_>::TPZFront
            (&(this->fFront).super_TPZFront<std::complex<double>_>,&PTR_PTR_0198eec0,
             &(cp->fFront).super_TPZFront<std::complex<double>_>);
  (this->fFront).super_TPZFront<std::complex<double>_>.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFrontSym_0198ee48;
  iVar1 = cp->fLastDecomposed;
  this->fNumEq = cp->fNumEq;
  this->fLastDecomposed = iVar1;
  TPZVec<int>::TPZVec(&this->fNumElConnected,&cp->fNumElConnected);
  TPZVec<int>::TPZVec(&this->fNumElConnectedBackup,&cp->fNumElConnectedBackup);
  return;
}

Assistant:

TPZFrontMatrix(const TPZFrontMatrix &cp) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),TPZAbstractFrontMatrix<TVar>(cp), fStorage(cp.fStorage),
	fFront(cp.fFront),fNumEq(cp.fNumEq),fLastDecomposed(cp.fLastDecomposed), fNumElConnected(cp.fNumElConnected),fNumElConnectedBackup(cp.fNumElConnectedBackup)
    {
    }